

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O2

void printhead(fout f,rnndb *db)

{
  uint uVar1;
  size_t sVar2;
  rnnauthor *prVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  tm tm;
  stat sb;
  
  stat(f.name,(stat *)&sb);
  gmtime_r(&sb.st_mtim.tv_sec,(tm *)&tm);
  uVar7 = 0;
  fprintf((FILE *)f.file,"#ifndef %s\n",f.guard);
  fprintf((FILE *)f.file,"#define %s\n",f.guard);
  fputc(10,(FILE *)f.file);
  fwrite("/* Autogenerated file, DO NOT EDIT manually!\n\nThis file was generated by the rules-ng-ng headergen tool in this git repository:\nhttp://0x04.net/cgit/index.cgi/rules-ng-ng\ngit clone git://0x04.net/rules-ng-ng\n\nThe rules-ng-ng source files this header was generated from are:\n"
         ,0x112,1,(FILE *)f.file);
  uVar8 = db->filesnum;
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
  }
  uVar6 = 0;
  for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    sVar2 = strlen(db->files[uVar7]);
    uVar1 = (uint)sVar2;
    if ((uint)sVar2 < uVar6) {
      uVar1 = uVar6;
    }
    uVar6 = uVar1;
  }
  for (lVar10 = 0; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
    pcVar5 = db->files[lVar10];
    sVar2 = strlen(pcVar5);
    fprintf((FILE *)f.file,"- %s%*s ",pcVar5,(ulong)(uVar6 - (int)sVar2),"");
    print_file_info(f.file,db->files[lVar10]);
    uVar8 = db->filesnum;
  }
  fwrite("\nCopyright (C) ",0xf,1,(FILE *)f.file);
  uVar8 = (db->copyright).firstyear;
  if ((uVar8 != 0) && (uVar8 < tm.tm_year + 0x76cU)) {
    fprintf((FILE *)f.file,"%u-");
  }
  fprintf((FILE *)f.file,"%u",(ulong)(tm.tm_year + 0x76c));
  if ((db->copyright).authorsnum != 0) {
    fwrite(" by the following authors:",0x1a,1,(FILE *)f.file);
    for (lVar10 = 0; lVar10 < (db->copyright).authorsnum; lVar10 = lVar10 + 1) {
      fwrite("\n- ",3,1,(FILE *)f.file);
      prVar3 = (db->copyright).authors[lVar10];
      if (prVar3->name != (char *)0x0) {
        fputs(prVar3->name,(FILE *)f.file);
        prVar3 = (db->copyright).authors[lVar10];
      }
      if (prVar3->email != (char *)0x0) {
        fprintf((FILE *)f.file," <%s>");
        prVar3 = (db->copyright).authors[lVar10];
      }
      iVar4 = prVar3->nicknamesnum;
      if (iVar4 != 0) {
        for (lVar11 = 0; lVar11 < iVar4; lVar11 = lVar11 + 1) {
          pcVar5 = ", ";
          if (lVar11 == 0) {
            pcVar5 = " (";
          }
          fprintf((FILE *)f.file,"%s%s",pcVar5,prVar3->nicknames[lVar11]);
          prVar3 = (db->copyright).authors[lVar10];
          iVar4 = prVar3->nicknamesnum;
        }
        fputc(0x29,(FILE *)f.file);
      }
    }
  }
  fputc(10,(FILE *)f.file);
  if ((db->copyright).license != (char *)0x0) {
    fprintf((FILE *)f.file,"\n%s\n");
  }
  fwrite("*/\n\n\n",5,1,(FILE *)f.file);
  return;
}

Assistant:

void printhead(struct fout f, struct rnndb *db) {
	int i, j;
	struct stat sb;
	struct tm tm;
	stat(f.name, &sb);
	gmtime_r(&sb.st_mtime, &tm);
	fprintf (f.file, "#ifndef %s\n", f.guard);
	fprintf (f.file, "#define %s\n", f.guard);
	fprintf (f.file, "\n");
	fprintf(f.file,
		"/* Autogenerated file, DO NOT EDIT manually!\n"
		"\n"
		"This file was generated by the rules-ng-ng headergen tool in this git repository:\n"
		"http://0x04.net/cgit/index.cgi/rules-ng-ng\n"
		"git clone git://0x04.net/rules-ng-ng\n"
		"\n"
		"The rules-ng-ng source files this header was generated from are:\n");
	unsigned maxlen = 0;
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		if(len > maxlen)
			maxlen = len;
	}
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		fprintf(f.file, "- %s%*s ", db->files[i], maxlen - len, "");
		print_file_info(f.file, db->files[i]);
	}
	fprintf(f.file,
		"\n"
		"Copyright (C) ");
	if(db->copyright.firstyear && db->copyright.firstyear < (1900 + tm.tm_year))
		fprintf(f.file, "%u-", db->copyright.firstyear);
	fprintf(f.file, "%u", 1900 + tm.tm_year);
	if(db->copyright.authorsnum) {
		fprintf(f.file, " by the following authors:");
		for(i = 0; i < db->copyright.authorsnum; ++i) {
			fprintf(f.file, "\n- ");
			if(db->copyright.authors[i]->name)
				fprintf(f.file, "%s", db->copyright.authors[i]->name);
			if(db->copyright.authors[i]->email)
				fprintf(f.file, " <%s>", db->copyright.authors[i]->email);
			if(db->copyright.authors[i]->nicknamesnum) {
				for(j = 0; j < db->copyright.authors[i]->nicknamesnum; ++j) {
					fprintf(f.file, "%s%s", (j ? ", " : " ("), db->copyright.authors[i]->nicknames[j]);
				}
				fprintf(f.file, ")");
			}
		}
	}
	fprintf(f.file, "\n");
	if(db->copyright.license)
		fprintf(f.file, "\n%s\n", db->copyright.license);
	fprintf(f.file, "*/\n\n\n");
}